

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O2

void ZopfliCleanLZ77Store(ZopfliLZ77Store *store)

{
  free(store->litlens);
  free(store->dists);
  free(store->pos);
  free(store->ll_symbol);
  free(store->d_symbol);
  free(store->ll_counts);
  free(store->d_counts);
  return;
}

Assistant:

void ZopfliCleanLZ77Store(ZopfliLZ77Store* store) {
  free(store->litlens);
  free(store->dists);
  free(store->pos);
  free(store->ll_symbol);
  free(store->d_symbol);
  free(store->ll_counts);
  free(store->d_counts);
}